

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::~cmServer(cmServer *this)

{
  bool bVar1;
  reference ppcVar2;
  cmServerProtocol *p;
  iterator __end1;
  iterator __begin1;
  vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *__range1;
  cmServer *this_local;
  
  (this->super_cmServerBase)._vptr_cmServerBase = (_func_int **)&PTR__cmServer_00bbf5e0;
  cmServerBase::Close(&this->super_cmServerBase);
  __end1 = std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::begin
                     (&this->SupportedProtocols);
  p = (cmServerProtocol *)
      std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::end
                (&this->SupportedProtocols);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
                                *)&p);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
              ::operator*(&__end1);
    if (*ppcVar2 != (cmServerProtocol *)0x0) {
      (*(*ppcVar2)->_vptr_cmServerProtocol[1])();
    }
    __gnu_cxx::
    __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::~vector
            (&this->SupportedProtocols);
  std::shared_ptr<cmFileMonitor>::~shared_ptr(&this->fileMonitor);
  cmServerBase::~cmServerBase(&this->super_cmServerBase);
  return;
}

Assistant:

cmServer::~cmServer()
{
  Close();

  for (cmServerProtocol* p : this->SupportedProtocols) {
    delete p;
  }
}